

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MatrixDynSize.cpp
# Opt level: O1

void __thiscall
iDynTree::MatrixDynSize::MatrixDynSize
          (MatrixDynSize *this,double *in_data,size_t in_rows,size_t in_cols)

{
  double *__dest;
  ulong uVar1;
  
  this->_vptr_MatrixDynSize = (_func_int **)&PTR__MatrixDynSize_0015fc68;
  this->m_rows = in_rows;
  this->m_cols = in_cols;
  uVar1 = in_cols * in_rows;
  if (uVar1 != 0) {
    this->m_capacity = uVar1;
    __dest = (double *)operator_new__(-(ulong)(uVar1 >> 0x3d != 0) | uVar1 * 8);
    this->m_data = __dest;
    memcpy(__dest,in_data,uVar1 * 8);
    return;
  }
  this->m_data = (double *)0x0;
  this->m_capacity = 0;
  return;
}

Assistant:

MatrixDynSize::MatrixDynSize(const double* in_data,
                             const std::size_t in_rows,
                             const std::size_t in_cols): m_rows(in_rows),
                                                          m_cols(in_cols)
{
    if( this->m_rows*this->m_cols == 0 )
    {
        this->m_data = 0;
        this->m_capacity = 0;
    }
    else
    {
        this->m_capacity = this->m_rows*this->m_cols;
        this->m_data = new double[this->m_capacity];
        std::memcpy(this->m_data,in_data,in_rows*in_cols*sizeof(double));
    }
}